

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polygon.cpp
# Opt level: O2

void __thiscall
vectorgraphics::Polygon2D::Polygon2D
          (Polygon2D *this,
          vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
          *point_ptrs)

{
  pointer psVar1;
  ulong uVar2;
  shared_ptr<vectorgraphics::Point2D> *__args_1;
  long lVar3;
  shared_ptr<vectorgraphics::LineSegment2D> sStack_48;
  vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
  *local_38;
  
  local_38 = &this->point_ptrs_;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
  ::vector(local_38,point_ptrs);
  lVar3 = 0x10;
  for (uVar2 = 1;
      psVar1 = (this->point_ptrs_).
               super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      __args_1 = (shared_ptr<vectorgraphics::Point2D> *)
                 ((long)&psVar1[-1].
                         super___shared_ptr<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + lVar3),
      uVar2 < (ulong)((long)(this->point_ptrs_).
                            super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
      uVar2 = uVar2 + 1) {
    std::
    make_shared<vectorgraphics::LineSegment2D,std::shared_ptr<vectorgraphics::Point2D>&,std::shared_ptr<vectorgraphics::Point2D>&>
              ((shared_ptr<vectorgraphics::Point2D> *)&sStack_48,__args_1);
    std::
    vector<std::shared_ptr<vectorgraphics::LineSegment2D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>>>
    ::emplace_back<std::shared_ptr<vectorgraphics::LineSegment2D>>
              ((vector<std::shared_ptr<vectorgraphics::LineSegment2D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>>>
                *)&this->line_segment_ptrs_,&sStack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sStack_48.
                super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    lVar3 = lVar3 + 0x10;
  }
  std::
  make_shared<vectorgraphics::LineSegment2D,std::shared_ptr<vectorgraphics::Point2D>&,std::shared_ptr<vectorgraphics::Point2D>&>
            ((shared_ptr<vectorgraphics::Point2D> *)&sStack_48,__args_1);
  std::
  vector<std::shared_ptr<vectorgraphics::LineSegment2D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>>>
  ::emplace_back<std::shared_ptr<vectorgraphics::LineSegment2D>>
            ((vector<std::shared_ptr<vectorgraphics::LineSegment2D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>>>
              *)&this->line_segment_ptrs_,&sStack_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_48.
              super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

Polygon2D::Polygon2D(std::vector<Point2DPtr> point_ptrs) :
    point_ptrs_(point_ptrs) {
    size_t index=1;
    while(index < point_ptrs_.size()) {
      line_segment_ptrs_.push_back(std::make_shared<LineSegment2D>(point_ptrs_[index-1], point_ptrs_[index]));
      index += 1;
    }
    line_segment_ptrs_.push_back(std::make_shared<LineSegment2D>(point_ptrs_[index-1], point_ptrs_[0]));
  }